

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::handle_exception(torrent *this)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  error_code local_48;
  long local_38 [2];
  
  auVar6 = __cxa_rethrow();
  if (auVar6._8_4_ == 3) {
    plVar3 = (long *)__cxa_begin_catch(auVar6._0_8_);
    iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar2 != '\0') {
      uVar1 = *(uint *)(plVar3 + 2);
      (**(code **)(*(long *)plVar3[3] + 0x20))(&local_48,(long *)plVar3[3],uVar1);
      uVar5 = local_48._0_8_;
      uVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"torrent exception: (%d) %s: %s",(ulong)uVar1,uVar5,uVar4);
      if ((long *)local_48._0_8_ != local_38) {
        operator_delete((void *)local_48._0_8_,local_38[0] + 1);
      }
    }
    local_48._0_8_ = plVar3[2];
    local_48.cat_ = (error_category *)plVar3[3];
    set_error(this,&local_48,(file_index_t)0xfffffffb);
  }
  else {
    plVar3 = (long *)__cxa_begin_catch(auVar6._0_8_);
    if (auVar6._8_4_ == 2) {
      local_48._0_8_ = (ulong)(uint3)local_48._5_3_ << 0x28;
      local_48.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      set_error(this,&local_48,(file_index_t)0xfffffffb);
      iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar2 != '\0') {
        uVar5 = (**(code **)(*plVar3 + 0x10))(plVar3);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"torrent exception: %s",uVar5);
      }
    }
    else {
      local_48._0_8_ = (ulong)(uint3)local_48._5_3_ << 0x28;
      local_48.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      set_error(this,&local_48,(file_index_t)0xfffffffb);
      iVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar2 != '\0') {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"torrent exception: unknown");
      }
    }
  }
  __cxa_end_catch();
  return;
}

Assistant:

void torrent::handle_exception()
	{
		try
		{
			throw;
		}
		catch (system_error const& err)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: (%d) %s: %s"
					, err.code().value(), err.code().message().c_str()
					, err.what());
			}
#endif
			set_error(err.code(), torrent_status::error_file_exception);
		}
		catch (std::exception const& err)
		{
			TORRENT_UNUSED(err);
			set_error(error_code(), torrent_status::error_file_exception);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: %s", err.what());
			}
#endif
		}
		catch (...)
		{
			set_error(error_code(), torrent_status::error_file_exception);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("torrent exception: unknown");
			}
#endif
		}
	}